

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O2

vector<PointData,_std::allocator<PointData>_> * __thiscall
Harris::GetMaximaPoints
          (vector<PointData,_std::allocator<PointData>_> *__return_storage_ptr__,Harris *this,
          float percentage,int filterRange,int suppressionRadius)

{
  int iVar1;
  vector<PointData,_std::allocator<PointData>_> *this_00;
  int iVar2;
  pointer pPVar3;
  int c;
  long lVar4;
  value_type *__x;
  pointer pPVar5;
  long lVar6;
  int r;
  long lVar7;
  float fVar8;
  Point PVar9;
  value_type local_e4;
  float local_d8;
  int iStack_d4;
  undefined8 uStack_d0;
  vector<PointData,_std::allocator<PointData>_> *local_c0;
  vector<PointData,_std::allocator<PointData>_> points;
  Mat maximaSuppressionMat;
  long local_80;
  long *local_48;
  
  _local_d8 = CONCAT44(iStack_d4,percentage);
  iVar2 = *(int *)&this->field_0x8;
  iVar1 = *(int *)&this->field_0xc;
  local_c0 = __return_storage_ptr__;
  cv::Scalar_<double>::all((Scalar_<double> *)&points,0.0);
  cv::Mat::Mat(&maximaSuppressionMat,iVar2,iVar1,5,(Scalar_ *)&points);
  points.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  points.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  points.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (lVar7 = 0; lVar7 < *(int *)&this->field_0x8; lVar7 = lVar7 + 1) {
    for (lVar4 = 0; lVar4 < *(int *)&this->field_0xc; lVar4 = lVar4 + 1) {
      local_e4.cornerResponse =
           *(float *)(**(long **)&this->field_0x48 * lVar7 + *(long *)&this->field_0x10 + lVar4 * 4)
      ;
      local_e4.point.x = (int)lVar7;
      local_e4.point.y = (int)lVar4;
      std::vector<PointData,_std::allocator<PointData>_>::push_back(&points,&local_e4);
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<PointData*,std::vector<PointData,std::allocator<PointData>>>,__gnu_cxx::__ops::_Iter_comp_iter<CornerResponse>>
            (points.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
             super__Vector_impl_data._M_start,
             points.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
             super__Vector_impl_data._M_finish);
  this_00 = local_c0;
  fVar8 = (float)(*(int *)&this->field_0x8 * *(int *)&this->field_0xc) * local_d8;
  (local_c0->super__Vector_base<PointData,_std::allocator<PointData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_c0->super__Vector_base<PointData,_std::allocator<PointData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_c0->super__Vector_base<PointData,_std::allocator<PointData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8 = (float)(filterRange + 1);
  uStack_d0 = 0;
  pPVar3 = (pointer)0x0;
  pPVar5 = (pointer)0x0;
  iStack_d4 = (int)local_d8;
  for (lVar7 = 0;
      ((ulong)(((long)pPVar5 - (long)pPVar3) / 0xc) < (ulong)(long)(int)fVar8 &&
      (((long)points.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)points.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
             super__Vector_impl_data._M_start) / 0xc != lVar7)); lVar7 = lVar7 + 1) {
    lVar4 = *local_48;
    if (*(int *)(points.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7].point.x * lVar4 + local_80 +
                (long)points.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7].point.y * 4) == 0) {
      __x = points.super__Vector_base<PointData,_std::allocator<PointData>_>._M_impl.
            super__Vector_impl_data._M_start + lVar7;
      for (iVar2 = -suppressionRadius; lVar6 = (long)-suppressionRadius, iVar2 <= suppressionRadius;
          iVar2 = iVar2 + 1) {
        for (; (int)lVar6 <= suppressionRadius; lVar6 = lVar6 + 1) {
          *(undefined4 *)
           (((__x->point).x + lVar6) * lVar4 + local_80 + ((long)iVar2 + (long)(__x->point).y) * 4)
               = 1;
        }
      }
      PVar9.x = (__x->point).x + (int)local_d8;
      PVar9.y = (__x->point).y + iStack_d4;
      __x->point = PVar9;
      std::vector<PointData,_std::allocator<PointData>_>::push_back(this_00,__x);
      pPVar3 = (this_00->super__Vector_base<PointData,_std::allocator<PointData>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pPVar5 = (this_00->super__Vector_base<PointData,_std::allocator<PointData>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  std::_Vector_base<PointData,_std::allocator<PointData>_>::~_Vector_base
            (&points.super__Vector_base<PointData,_std::allocator<PointData>_>);
  cv::Mat::~Mat(&maximaSuppressionMat);
  return this_00;
}

Assistant:

vector<PointData> Harris::GetMaximaPoints(float percentage, int filterRange, int suppressionRadius) {
    // Declare a max suppression matrix
    Mat maximaSuppressionMat(harrisResponses.rows, harrisResponses.cols, CV_32F, Scalar::all(0));

    // Create a vector of all Points
    std::vector<PointData> points;
    for (int r = 0; r < harrisResponses.rows; r++) {
        for (int c = 0; c < harrisResponses.cols; c++) {
            Point p(r,c); 

            PointData d;
            d.cornerResponse = harrisResponses.at<float>(r,c);
            d.point = p;

            points.push_back(d);
        }
    }

    // Sort points by corner Response
    sort(points.begin(), points.end(), CornerResponse());

    // Get top points, given by the percentage
    int numberTopPoints = harrisResponses.cols * harrisResponses.rows * percentage;
    std::vector<PointData> topPoints;

    int i=0;
    while(topPoints.size() < numberTopPoints) {
        if(i == points.size())
            break;

        int supRows = maximaSuppressionMat.rows;
        int supCols = maximaSuppressionMat.cols;

        // Check if point marked in maximaSuppression matrix
        if(maximaSuppressionMat.at<int>(points[i].point.x,points[i].point.y) == 0) {
            for (int r = -suppressionRadius; r <= suppressionRadius; r++) {
                for (int c = -suppressionRadius; c <= suppressionRadius; c++) {
                    int sx = points[i].point.x+c;
                    int sy = points[i].point.y+r;

                    // bound checking
                    if(sx > supRows)
                        sx = supRows;
                    if(sx < 0)
                        sx = 0;
                    if(sy > supCols)
                        sy = supCols;
                    if(sy < 0)
                        sy = 0;

                    maximaSuppressionMat.at<int>(points[i].point.x+c, points[i].point.y+r) = 1;
                }
            }

            // Convert back to original image coordinate system 
            points[i].point.x += 1 + filterRange;
            points[i].point.y += 1 + filterRange;
            topPoints.push_back(points[i]);
        }

        i++;
    }

    return topPoints;
}